

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O1

Node48 * duckdb::Node48::New(ART *art,Node *node)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  type paVar3;
  IndexPointer IVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  __hash_code __code;
  long *plVar7;
  long lVar8;
  
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  IVar4 = FixedSizeAllocator::New
                    (paVar3->_M_elems[4].
                     super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl);
  (node->super_IndexPointer).data = IVar4.data & 0xffffffffffffff | 0x500000000000000;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var1._M_head_impl =
       paVar3->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  plVar5 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                     ((IVar4.data & 0xffffffff) %
                     *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
  for (plVar7 = (long *)*plVar5; (IVar4.data & 0xffffffff) != plVar7[1]; plVar7 = (long *)*plVar7) {
    plVar5 = plVar7;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar5 + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  lVar8 = (ulong)((uint)(IVar4.data >> 0x20) & 0xffffff) * (_Var1._M_head_impl)->segment_size;
  iVar2 = (_Var1._M_head_impl)->bitmask_offset;
  pdVar6[iVar2 + lVar8] = '\0';
  switchD_01306cb1::default(pdVar6 + iVar2 + lVar8 + 1,0x30,0x100);
  switchD_01306cb1::default(pdVar6 + iVar2 + lVar8 + 0x108,0,0x180);
  return (Node48 *)(pdVar6 + iVar2 + lVar8);
}

Assistant:

Node48 &Node48::New(ART &art, Node &node) {
	node = Node::GetAllocator(art, NODE_48).New();
	node.SetMetadata(static_cast<uint8_t>(NODE_48));
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	n48.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		n48.child_index[i] = EMPTY_MARKER;
	}
	for (uint8_t i = 0; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	return n48;
}